

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20250127::debugging_internal::ParseExprPrimary(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  ParseState copy;
  
  iVar7 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar7 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar7) {
    bVar8 = false;
    goto LAB_00d1a99f;
  }
  pPVar1 = &state->parse_state;
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar6 = ParseTwoCharToken(state,"LZ");
  if (bVar6) {
    bVar6 = ParseEncoding(state);
LAB_00d1a97a:
    if (bVar6 != false) {
      bVar6 = ParseOneCharToken(state,'E');
LAB_00d1a98c:
      bVar8 = true;
      if (bVar6 != false) goto LAB_00d1a99a;
    }
LAB_00d1a990:
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar8 = false;
  }
  else {
    bVar6 = ParseOneCharToken(state,'L');
    if (!bVar6) {
LAB_00d1a95b:
      pPVar1->mangled_idx = uVar3;
      pPVar1->out_cur_idx = uVar4;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
      bVar6 = ParseOneCharToken(state,'L');
      if (bVar6) {
        bVar6 = ParseMangledName(state);
        goto LAB_00d1a97a;
      }
      goto LAB_00d1a990;
    }
    bVar6 = ParseThreeCharToken(state,"DnE");
    bVar8 = true;
    if (!bVar6) {
      if (state->mangled_begin[(state->parse_state).mangled_idx] != 'A') {
        bVar6 = ParseType(state);
        if (bVar6) {
          bVar6 = ParseExprCastValueAndTrailingE(state);
          if (bVar6) goto LAB_00d1a99a;
        }
        goto LAB_00d1a95b;
      }
      bVar6 = ParseType(state);
      if (!bVar6) goto LAB_00d1a990;
      bVar6 = ParseOneCharToken(state,'E');
      goto LAB_00d1a98c;
    }
  }
LAB_00d1a99a:
  iVar7 = state->recursion_depth + -1;
LAB_00d1a99f:
  state->recursion_depth = iVar7;
  return bVar8;
}

Assistant:

static bool ParseExprPrimary(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // The "LZ" special case: if we see LZ, we commit to accept "LZ <encoding> E"
  // or fail, no backtracking.
  if (ParseTwoCharToken(state, "LZ")) {
    if (ParseEncoding(state) && ParseOneCharToken(state, 'E')) {
      return true;
    }

    state->parse_state = copy;
    return false;
  }

  if (ParseOneCharToken(state, 'L')) {
    // There are two special cases in which a literal may or must contain a type
    // without a value.  The first is that both LDnE and LDn0E are valid
    // encodings of nullptr, used in different situations.  Recognize LDnE here,
    // leaving LDn0E to be recognized by the general logic afterward.
    if (ParseThreeCharToken(state, "DnE")) return true;

    // The second special case is a string literal, currently mangled in C++98
    // style as LA<length + 1>_KcE.  This is inadequate to support C++11 and
    // later versions, and the discussion of this problem has not converged.
    //
    // https://github.com/itanium-cxx-abi/cxx-abi/issues/64
    //
    // For now the bare-type mangling is what's used in practice, so we
    // recognize this form and only this form if an array type appears here.
    // Someday we'll probably have to accept a new form of value mangling in
    // LA...E constructs.  (Note also that C++20 allows a wide range of
    // class-type objects as template arguments, so someday their values will be
    // mangled and we'll have to recognize them here too.)
    if (RemainingInput(state)[0] == 'A' /* an array type follows */) {
      if (ParseType(state) && ParseOneCharToken(state, 'E')) return true;
      state->parse_state = copy;
      return false;
    }

    // The merged cast production.
    if (ParseType(state) && ParseExprCastValueAndTrailingE(state)) {
      return true;
    }
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'L') && ParseMangledName(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  return false;
}